

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# colTrie.c
# Opt level: O0

Col_Word Col_CopyTrieMap(Col_Word map)

{
  Cell *pacVar1;
  Col_Word newMap;
  Col_Word map_local;
  
  pacVar1 = AllocCells(1);
  *(undefined8 *)*pacVar1 = *(undefined8 *)map;
  *(undefined8 *)(*pacVar1 + 8) = *(undefined8 *)(map + 8);
  *(undefined8 *)(*pacVar1 + 0x10) = *(undefined8 *)(map + 0x10);
  *(undefined8 *)(*pacVar1 + 0x18) = *(undefined8 *)(map + 0x18);
  *(char *)((long)pacVar1 + 8) = '\0';
  *(char *)((long)pacVar1 + 9) = '\0';
  *(char *)((long)pacVar1 + 10) = '\0';
  *(char *)((long)pacVar1 + 0xb) = '\0';
  *(char *)((long)pacVar1 + 0xc) = '\0';
  *(char *)((long)pacVar1 + 0xd) = '\0';
  *(char *)((long)pacVar1 + 0xe) = '\0';
  *(char *)((long)pacVar1 + 0xf) = '\0';
  (*pacVar1)[0] = (*pacVar1)[0] & 0xfe;
  FreezeSubtrie(*(Col_Word *)(map + 0x18));
  return (Col_Word)pacVar1;
}

Assistant:

Col_Word
Col_CopyTrieMap(
    Col_Word map)   /*!< Trie map to copy. */
{
    Col_Word newMap;

    /*
     * Check preconditions.
     */

    /*! @typecheck{COL_ERROR_TRIEMAP,map} */
    TYPECHECK_TRIEMAP(map) return WORD_NIL;

    /*
     * Copy word first.
     */

    //TODO: provide custom data copy mechanism
    newMap = (Col_Word) AllocCells(1);
    memcpy((void *) newMap, (void *) map, sizeof(Cell));
    WORD_SYNONYM(newMap) = WORD_NIL;
    WORD_CLEAR_PINNED(newMap);

    /*
     * Freeze nodes recursively.
     */

    FreezeSubtrie(WORD_TRIEMAP_ROOT(map));

    /*
     * Both maps now share the same immutable structure.
     */

    return newMap;
}